

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastMultiplier(Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vTemp,
                        Vec_Int_t *vRes,int fSigned)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  int *ps;
  ulong uVar5;
  ulong uVar6;
  int Carry;
  int *local_70;
  ulong local_68;
  int *local_60;
  ulong local_58;
  Gia_Man_t *local_50;
  long local_48;
  int *local_40;
  int *local_38;
  
  Carry = fSigned;
  local_50 = pNew;
  local_40 = pArgA;
  local_38 = pArgB;
  if ((0 < nArgA) && (0 < nArgB)) {
    if ((uint)fSigned < 2) {
      uVar2 = (ulong)(uint)nArgA;
      Vec_IntFill(vRes,nArgB + nArgA,0);
      local_60 = vRes->pArray;
      Vec_IntFill(vTemp,nArgA * 2,0);
      piVar1 = vTemp->pArray;
      local_70 = piVar1 + uVar2;
      local_48 = uVar2 * 4 + -4;
      uVar6 = 0;
      local_68 = (ulong)(uint)nArgB;
      local_58 = uVar2;
      while (uVar5 = uVar6, uVar5 != local_68) {
        piVar4 = local_60 + uVar5;
        for (lVar3 = 0; uVar6 = uVar5 + 1, uVar2 * 4 - lVar3 != 0; lVar3 = lVar3 + 4) {
          ps = (int *)((long)local_70 + lVar3) + -1;
          if (lVar3 == 0) {
            ps = piVar4;
          }
          Wlc_BlastFullAdderCtrl
                    (local_50,*(int *)((long)local_40 + lVar3),local_38[uVar5],
                     *(int *)((long)local_70 + lVar3),*(int *)((long)piVar1 + lVar3),
                     (int *)(lVar3 + (long)piVar1),ps,
                     (uint)((local_48 == lVar3) != (uVar5 + 1 == local_68) && fSigned != 0));
        }
      }
      local_70[local_58 - 1] = fSigned;
      piVar4 = local_60 + local_68;
      for (uVar6 = 0; local_58 != uVar6; uVar6 = uVar6 + 1) {
        Wlc_BlastFullAdderCtrl(local_50,1,piVar1[uVar6],local_70[uVar6],Carry,&Carry,piVar4,0);
        piVar4 = piVar4 + 1;
      }
      return;
    }
    __assert_fail("fSigned == 0 || fSigned == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x22d,
                  "void Wlc_BlastMultiplier(Gia_Man_t *, int *, int *, int, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  __assert_fail("nArgA > 0 && nArgB > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x22c,
                "void Wlc_BlastMultiplier(Gia_Man_t *, int *, int *, int, int, Vec_Int_t *, Vec_Int_t *, int)"
               );
}

Assistant:

void Wlc_BlastMultiplier( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vTemp, Vec_Int_t * vRes, int fSigned )
{
    int * pRes, * pArgC, * pArgS, a, b, Carry = fSigned;
    assert( nArgA > 0 && nArgB > 0 );
    assert( fSigned == 0 || fSigned == 1 );
    // prepare result
    Vec_IntFill( vRes, nArgA + nArgB, 0 );
    //Vec_IntFill( vRes, nArgA + nArgB + 1, 0 );
    pRes = Vec_IntArray( vRes );
    // prepare intermediate storage
    Vec_IntFill( vTemp, 2 * nArgA, 0 );
    pArgC = Vec_IntArray( vTemp );
    pArgS = pArgC + nArgA;
    // create matrix
    for ( b = 0; b < nArgB; b++ )
        for ( a = 0; a < nArgA; a++ )
            Wlc_BlastFullAdderCtrl( pNew, pArgA[a], pArgB[b], pArgS[a], pArgC[a], 
                &pArgC[a], a ? &pArgS[a-1] : &pRes[b], fSigned && ((a+1 == nArgA) ^ (b+1 == nArgB)) );
    // final addition
    pArgS[nArgA-1] = fSigned;
    for ( a = 0; a < nArgA; a++ )
        Wlc_BlastFullAdderCtrl( pNew, 1, pArgC[a], pArgS[a], Carry, &Carry, &pRes[nArgB+a], 0 );
    //Vec_IntWriteEntry( vRes, nArgA + nArgB, Carry );
}